

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_freeCCtx(ZSTD_CCtx *cctx)

{
  ZSTD_customMem customMem;
  int iVar1;
  void *in_RDI;
  int cctxInWorkspace;
  ZSTD_CCtx *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  if (in_RDI == (void *)0x0) {
    local_8 = 0;
  }
  else if (*(long *)((long)in_RDI + 0x370) == 0) {
    iVar1 = ZSTD_cwksp_owns_buffer((ZSTD_cwksp *)((long)in_RDI + 0x290),in_RDI);
    ZSTD_freeCCtxContent(in_stack_ffffffffffffffe0);
    if (iVar1 == 0) {
      customMem.customFree._0_4_ = in_stack_ffffffffffffffe8;
      customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffe0;
      customMem.customFree._4_4_ = 0;
      customMem.opaque = in_RDI;
      ZSTD_customFree(*(void **)((long)in_RDI + 0x358),customMem);
    }
    local_8 = 0;
  }
  else {
    local_8 = 0xffffffffffffffc0;
  }
  return local_8;
}

Assistant:

size_t ZSTD_freeCCtx(ZSTD_CCtx* cctx)
{
    if (cctx==NULL) return 0;   /* support free on NULL */
    RETURN_ERROR_IF(cctx->staticSize, memory_allocation,
                    "not compatible with static CCtx");
    {   int cctxInWorkspace = ZSTD_cwksp_owns_buffer(&cctx->workspace, cctx);
        ZSTD_freeCCtxContent(cctx);
        if (!cctxInWorkspace) ZSTD_customFree(cctx, cctx->customMem);
    }
    return 0;
}